

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnected_transactions.h
# Opt level: O2

void __thiscall
DisconnectedBlockTransactions::DisconnectedBlockTransactions
          (DisconnectedBlockTransactions *this,size_t max_mem_usage)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->cachedInnerUsage = 0;
  this->m_max_mem_usage = max_mem_usage;
  (this->queuedTx).
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->queuedTx;
  (this->queuedTx).
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->queuedTx;
  (this->queuedTx).
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node._M_size = 0;
  std::
  _Hashtable<uint256,_std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>,_std::allocator<std::pair<const_uint256,_std::_List_iterator<std::shared_ptr<const_CTransaction>_>_>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&(this->iters_by_txid)._M_h);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

DisconnectedBlockTransactions(size_t max_mem_usage)
        : m_max_mem_usage{max_mem_usage} {}